

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O0

void reset_game(void)

{
  Am_Object local_30;
  undefined4 local_28;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Am_Object(&local_10,(Am_Object *)&anim);
  Am_Object::Am_Object(&local_18,(Am_Object *)&Am_No_Object);
  local_28 = _Am_Default_Stop_Char;
  Am_Object::Am_Object(&local_30,(Am_Object *)&Am_No_Object);
  Am_Stop_Interactor(&local_10,&local_18,local_28,&local_30,0,0,1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Set(0xa2d0,true,0);
  Am_Object::Set(0xa2d8,true,1);
  return;
}

Assistant:

void
reset_game()
{
  Am_Stop_Interactor(anim);
  ball.Set(Am_VISIBLE, false);
  start_button.Set(Am_VISIBLE, true);
}